

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

void __thiscall FIX::SocketMonitor::SocketMonitor(SocketMonitor *this,int timeout)

{
  _Rb_tree_header *p_Var1;
  pair<int,_int> pVar2;
  clock_t cVar3;
  
  this->_vptr_SocketMonitor = (_func_int **)&PTR__SocketMonitor_001fe820;
  this->m_timeout = timeout;
  p_Var1 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header;
  (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::queue<int,std::deque<int,std::allocator<int>>>::
  queue<std::deque<int,std::allocator<int>>,void>(&this->m_dropped);
  socket_init();
  pVar2 = socket_createpair();
  this->m_signal = pVar2.first;
  this->m_interrupt = pVar2.second;
  socket_setnonblock(pVar2.first);
  socket_setnonblock(this->m_interrupt);
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
             &this->m_readSockets,&this->m_interrupt);
  cVar3 = clock();
  this->m_ticks = cVar3;
  return;
}

Assistant:

SocketMonitor::SocketMonitor(int timeout)
    : m_timeout(timeout) {
  socket_init();

  std::pair<socket_handle, socket_handle> sockets = socket_createpair();
  m_signal = sockets.first;
  m_interrupt = sockets.second;
  socket_setnonblock(m_signal);
  socket_setnonblock(m_interrupt);
  m_readSockets.insert(m_interrupt);

  m_ticks = clock();
}